

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O0

void createargtable(lua_State *L,char **argv,int argc,int script)

{
  int local_24;
  int narg;
  int i;
  int script_local;
  int argc_local;
  char **argv_local;
  lua_State *L_local;
  
  lua_createtable(L,argc - (script + 1),script + 1);
  for (local_24 = 0; local_24 < argc; local_24 = local_24 + 1) {
    lua_pushstring(L,argv[local_24]);
    lua_rawseti(L,-2,(long)(local_24 - script));
  }
  lua_setglobal(L,"arg");
  return;
}

Assistant:

static void createargtable (lua_State *L, char **argv, int argc, int script) {
  int i, narg;
  narg = argc - (script + 1);  /* number of positive indices */
  lua_createtable(L, narg, script + 1);
  for (i = 0; i < argc; i++) {
    lua_pushstring(L, argv[i]);
    lua_rawseti(L, -2, i - script);
  }
  lua_setglobal(L, "arg");
}